

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

target_ulong
helper_taddcctv_sparc64(CPUSPARCState_conflict1 *env,target_ulong src1,target_ulong src2)

{
  target_ulong tVar1;
  uint uVar2;
  uintptr_t unaff_retaddr;
  
  uVar2 = (uint)src1;
  if ((((uint)src2 | uVar2) & 3) == 0) {
    tVar1 = src2 + src1;
    if (-1 < (int)(((uint)tVar1 ^ uVar2) & ~(uVar2 ^ (uint)src2))) {
      env->cc_op = 6;
      env->cc_src = src1;
      env->cc_src2 = src2;
      env->cc_dst = tVar1;
      return tVar1;
    }
  }
  cpu_raise_exception_ra_sparc64(env,0x23,unaff_retaddr);
}

Assistant:

target_ulong helper_taddcctv(CPUSPARCState *env, target_ulong src1,
                             target_ulong src2)
{
    target_ulong dst;

    /* Tag overflow occurs if either input has bits 0 or 1 set.  */
    if ((src1 | src2) & 3) {
        goto tag_overflow;
    }

    dst = src1 + src2;

    /* Tag overflow occurs if the addition overflows.  */
    if (~(src1 ^ src2) & (src1 ^ dst) & (1u << 31)) {
        goto tag_overflow;
    }

    /* Only modify the CC after any exceptions have been generated.  */
    env->cc_op = CC_OP_TADDTV;
    env->cc_src = src1;
    env->cc_src2 = src2;
    env->cc_dst = dst;
    return dst;

 tag_overflow:
    cpu_raise_exception_ra(env, TT_TOVF, GETPC());
}